

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAdapter::makeOxygenFuncfl
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType drho,RealType nrho,
          vector<double,_std::allocator<double>_> *F)

{
  bool bVar1;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  ZhouParameters zhouParam;
  FuncflParameters funcflParam;
  EAMParameters eamParam;
  string *in_stack_fffffffffffffd28;
  AtomType *in_stack_fffffffffffffd30;
  ZhouParameters *this_00;
  ZhouParameters *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> local_270;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffda8;
  AtomType *in_stack_fffffffffffffdb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  string local_78 [32];
  undefined8 local_58;
  undefined8 local_10;
  
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  bVar1 = isEAM((EAMAdapter *)0x2fdbca);
  if (bVar1) {
    AtomType::removeProperty(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AtomType::removeProperty(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AtomType::removeProperty(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  std::__cxx11::string::string(local_78);
  local_58 = 0;
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fdcaa);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fdcd0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fdcfb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fdd8d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fddb3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fde45);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fde6b);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x2fde91);
  local_58 = local_10;
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  __args_1 = (ZhouParameters *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (__args,(EAMParameters *)__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffd30,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)in_stack_fffffffffffffd28
            );
  AtomType::addProperty(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fdfe0);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x2fdfed);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (__args,__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffd30,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)
             in_stack_fffffffffffffd28);
  AtomType::addProperty(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fe04a);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)0x2fe054);
  this_00 = (ZhouParameters *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (__args,(FuncflParameters *)__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)this_00,&local_270);
  AtomType::addProperty(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fe0a9);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)0x2fe0b3);
  ZhouParameters::~ZhouParameters(this_00);
  FuncflParameters::~FuncflParameters((FuncflParameters *)this_00);
  EAMParameters::~EAMParameters((EAMParameters *)0x2fe0da);
  return;
}

Assistant:

void EAMAdapter::makeOxygenFuncfl(RealType re, RealType fe, RealType alpha,
                                    RealType beta, RealType A, RealType B,
                                    RealType kappa, RealType lambda,
                                    RealType drho, RealType nrho,
                                    std::vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamOxygenFuncfl;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;

    funcflParam.F    = F;
    funcflParam.drho = drho;
    funcflParam.nrho = nrho;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }